

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EffectManager.cpp
# Opt level: O0

unique_ptr<EffectManager,_std::default_delete<EffectManager>_> EffectManager::create(void)

{
  initializer_list<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<EffectManager::EffectLauncherInterface>_>_>
  __l;
  void *pvVar1;
  __uniq_ptr_data<EffectManager,_std::default_delete<EffectManager>,_true,_true> in_RDI;
  EffectManager *mgt;
  EffectMap_t effects;
  EffectMap_t *in_stack_fffffffffffffe08;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<EffectManager::EffectLauncherInterface>_>
  *in_stack_fffffffffffffe10;
  shared_ptr<EffectManager::EffectLauncher<FNEffect>_> *in_stack_fffffffffffffe30;
  char (*in_stack_fffffffffffffe38) [3];
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<EffectManager::EffectLauncherInterface>_>
  *in_stack_fffffffffffffe40;
  undefined8 **ppuVar2;
  allocator_type *in_stack_fffffffffffffe50;
  less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *__comp;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<EffectManager::EffectLauncherInterface>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<EffectManager::EffectLauncherInterface>_>_>_>
  *this;
  iterator ppVar3;
  undefined1 *puVar4;
  less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_163 [2];
  undefined1 local_161;
  iterator local_110;
  undefined1 *local_108 [6];
  undefined1 local_d8 [48];
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<EffectManager::EffectLauncherInterface>_>
  local_a8;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<EffectManager::EffectLauncherInterface>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<EffectManager::EffectLauncherInterface>_>_>_>
  local_78;
  undefined8 *local_48;
  undefined8 local_40;
  
  local_161 = 1;
  local_110 = (iterator)local_108;
  std::make_shared<EffectManager::EffectLauncher<LREffect>>();
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<EffectManager::EffectLauncherInterface>_>
  ::pair<const_char_(&)[3],_std::shared_ptr<EffectManager::EffectLauncher<LREffect>_>,_true>
            (in_stack_fffffffffffffe40,in_stack_fffffffffffffe38,
             (shared_ptr<EffectManager::EffectLauncher<LREffect>_> *)in_stack_fffffffffffffe30);
  puVar4 = local_d8;
  local_110 = (iterator)puVar4;
  std::make_shared<EffectManager::EffectLauncher<RLEffect>>();
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<EffectManager::EffectLauncherInterface>_>
  ::pair<const_char_(&)[3],_std::shared_ptr<EffectManager::EffectLauncher<RLEffect>_>,_true>
            (in_stack_fffffffffffffe40,in_stack_fffffffffffffe38,
             (shared_ptr<EffectManager::EffectLauncher<RLEffect>_> *)in_stack_fffffffffffffe30);
  ppVar3 = &local_a8;
  local_110 = ppVar3;
  std::make_shared<EffectManager::EffectLauncher<NFEffect>>();
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<EffectManager::EffectLauncherInterface>_>
  ::pair<const_char_(&)[3],_std::shared_ptr<EffectManager::EffectLauncher<NFEffect>_>,_true>
            (in_stack_fffffffffffffe40,in_stack_fffffffffffffe38,
             (shared_ptr<EffectManager::EffectLauncher<NFEffect>_> *)in_stack_fffffffffffffe30);
  this = &local_78;
  local_110 = (iterator)this;
  std::make_shared<EffectManager::EffectLauncher<FNEffect>>();
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<EffectManager::EffectLauncherInterface>_>
  ::pair<const_char_(&)[3],_std::shared_ptr<EffectManager::EffectLauncher<FNEffect>_>,_true>
            (in_stack_fffffffffffffe40,in_stack_fffffffffffffe38,in_stack_fffffffffffffe30);
  local_161 = 0;
  local_48 = local_108;
  local_40 = 4;
  __comp = local_163;
  std::
  allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<EffectManager::EffectLauncherInterface>_>_>
  ::allocator((allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<EffectManager::EffectLauncherInterface>_>_>
               *)0x147ca4);
  __l._M_len = (size_type)puVar4;
  __l._M_array = ppVar3;
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<EffectManager::EffectLauncherInterface>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<EffectManager::EffectLauncherInterface>_>_>_>
  ::map(this,__l,__comp,in_stack_fffffffffffffe50);
  std::
  allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<EffectManager::EffectLauncherInterface>_>_>
  ::~allocator((allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<EffectManager::EffectLauncherInterface>_>_>
                *)0x147cdd);
  ppuVar2 = &local_48;
  do {
    ppuVar2 = ppuVar2 + -6;
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<EffectManager::EffectLauncherInterface>_>
    ::~pair(in_stack_fffffffffffffe10);
  } while (ppuVar2 != (undefined8 **)local_108);
  std::shared_ptr<EffectManager::EffectLauncher<FNEffect>_>::~shared_ptr
            ((shared_ptr<EffectManager::EffectLauncher<FNEffect>_> *)0x147d29);
  std::shared_ptr<EffectManager::EffectLauncher<NFEffect>_>::~shared_ptr
            ((shared_ptr<EffectManager::EffectLauncher<NFEffect>_> *)0x147d36);
  std::shared_ptr<EffectManager::EffectLauncher<RLEffect>_>::~shared_ptr
            ((shared_ptr<EffectManager::EffectLauncher<RLEffect>_> *)0x147d43);
  std::shared_ptr<EffectManager::EffectLauncher<LREffect>_>::~shared_ptr
            ((shared_ptr<EffectManager::EffectLauncher<LREffect>_> *)0x147d50);
  pvVar1 = operator_new(0x30);
  EffectManager((EffectManager *)in_stack_fffffffffffffe10,in_stack_fffffffffffffe08);
  if (pvVar1 == (void *)0x0) {
    std::unique_ptr<EffectManager,std::default_delete<EffectManager>>::
    unique_ptr<std::default_delete<EffectManager>,void>
              ((unique_ptr<EffectManager,_std::default_delete<EffectManager>_> *)
               in_stack_fffffffffffffe10,in_stack_fffffffffffffe08);
  }
  else {
    std::unique_ptr<EffectManager,std::default_delete<EffectManager>>::
    unique_ptr<std::default_delete<EffectManager>,void>
              ((unique_ptr<EffectManager,_std::default_delete<EffectManager>_> *)
               in_stack_fffffffffffffe10,(pointer)in_stack_fffffffffffffe08);
  }
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<EffectManager::EffectLauncherInterface>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<EffectManager::EffectLauncherInterface>_>_>_>
  ::~map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<EffectManager::EffectLauncherInterface>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<EffectManager::EffectLauncherInterface>_>_>_>
          *)0x147f78);
  return (__uniq_ptr_data<EffectManager,_std::default_delete<EffectManager>,_true,_true>)
         (tuple<EffectManager_*,_std::default_delete<EffectManager>_>)
         in_RDI.super___uniq_ptr_impl<EffectManager,_std::default_delete<EffectManager>_>._M_t.
         super__Tuple_impl<0UL,_EffectManager_*,_std::default_delete<EffectManager>_>.
         super__Head_base<0UL,_EffectManager_*,_false>._M_head_impl;
}

Assistant:

std::unique_ptr<EffectManager> EffectManager::create() 
{
	EffectMap_t effects = 
	{
		{"lr", std::make_shared<EffectLauncher<LREffect>>()},
		{"rl", std::make_shared<EffectLauncher<RLEffect>>()},
		{"nf", std::make_shared<EffectLauncher<NFEffect>>()},
		{"fn", std::make_shared<EffectLauncher<FNEffect>>()},
	};

	auto mgt = new EffectManager(effects);
	if (!mgt) 
	{
		return nullptr;
	}

	return std::unique_ptr<EffectManager>(std::move(mgt));
}